

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestBackslash::Run(ParserTestBackslash *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  string local_38;
  int local_14;
  ParserTestBackslash *pPStack_10;
  int fail_count;
  ParserTestBackslash *this_local;
  
  pPStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse(&this->super_ParserTest,"foo = bar\\baz\nfoo2 = bar\\ baz\n");
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foo",&local_59);
    BindingEnv::LookupVariable(&local_38,&(this->super_ParserTest).state.bindings_,&local_58);
    bVar3 = std::operator==("bar\\baz",&local_38);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0xd0,"\"bar\\\\baz\" == state.bindings_.LookupVariable(\"foo\")");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"foo2",&local_b1);
    BindingEnv::LookupVariable(&local_90,&(this->super_ParserTest).state.bindings_,&local_b0);
    bVar3 = std::operator==("bar\\ baz",&local_90);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0xd1,"\"bar\\\\ baz\" == state.bindings_.LookupVariable(\"foo2\")");
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, Backslash) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"foo = bar\\baz\n"
"foo2 = bar\\ baz\n"
));
  EXPECT_EQ("bar\\baz", state.bindings_.LookupVariable("foo"));
  EXPECT_EQ("bar\\ baz", state.bindings_.LookupVariable("foo2"));
}